

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O1

int __thiscall gdsForge::GDSwriteInt(gdsForge *this,int record,int *arrInt,int cnt)

{
  FILE *__s;
  long lVar1;
  uint uVar2;
  int iVar3;
  long *plVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  void *__ptr;
  uint uVar8;
  ulong uVar9;
  undefined8 uStack_60;
  int *local_58;
  undefined1 *local_50;
  gdsForge *local_48;
  int local_3c;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined4 local_34;
  uchar OHout [4];
  
  local_35 = (undefined1)record;
  uVar2 = record & 0xff;
  uVar8 = 2;
  local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)record >> 8),1);
  local_58 = arrInt;
  local_48 = this;
  if ((uVar2 != 2 || cnt < 1) && (uVar8 = 4, uVar2 != 3 || cnt < 1)) {
    if (uVar2 != 0 || cnt != 0) {
      uStack_60 = 0x11050e;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Incorrect parameters for record: 0x",0x23);
      *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      uStack_60 = 0x11052e;
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,record);
      uStack_60 = 0x110545;
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      uStack_60 = 0x110550;
      std::ostream::put((char)plVar4);
      uStack_60 = 0x110558;
      std::ostream::flush();
      *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
      return 1;
    }
    local_34 = 0;
    uVar8 = 0;
  }
  iVar3 = uVar8 * cnt + 4;
  local_38 = (undefined1)((uint)iVar3 >> 8);
  local_37 = (undefined1)iVar3;
  local_36 = (undefined1)((uint)record >> 8);
  uStack_60 = 0x1105b2;
  fwrite(&local_38,1,4,(FILE *)this->gdsFile);
  lVar1 = -(ulong)(uVar8 + 0xf & 0xfffffff0);
  __ptr = (void *)((long)&local_58 + lVar1);
  if (0 < cnt) {
    local_3c = uVar8 * 8 + -8;
    uVar7 = 1;
    if (1 < uVar8) {
      uVar7 = (ulong)uVar8;
    }
    uVar9 = 0;
    local_50 = (undefined1 *)&local_58;
    do {
      if ((char)local_34 != '\0') {
        iVar3 = local_58[uVar9];
        uVar6 = 0;
        iVar5 = local_3c;
        do {
          *(char *)((long)__ptr + uVar6) = (char)(iVar3 >> ((byte)iVar5 & 0x1f));
          uVar6 = uVar6 + 1;
          iVar5 = iVar5 + -8;
        } while (uVar7 != uVar6);
      }
      __s = (FILE *)local_48->gdsFile;
      *(undefined8 *)((long)&uStack_60 + lVar1) = 0x11062a;
      fwrite(__ptr,1,(ulong)uVar8,__s);
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uint)cnt);
  }
  return 0;
}

Assistant:

int gdsForge::GDSwriteInt(int record, int arrInt[], int cnt)
{
  unsigned int dataSize = record & 0xff;

  if (dataSize == 0x02 && cnt > 0) {
    dataSize = 2; // should/could be omitted
  } else if (dataSize == 0x03 && cnt > 0) {
    dataSize = 4;
  } else if (dataSize == 0x00 && cnt == 0) {
    dataSize = 0; // should/could be omitted
  } else {
    cout << "Incorrect parameters for record: 0x" << hex << record << endl;
    cout << dec;
    return 1;
  }

  unsigned int sizeByte = cnt * dataSize + 4;
  unsigned char OHout[4];

  OHout[0] = sizeByte >> 8 & 0xff;
  OHout[1] = sizeByte & 0xff;
  OHout[2] = record >> 8 & 0xff;
  OHout[3] = record & 0xff;
  fwrite(OHout, 1, 4, this->gdsFile);

  unsigned char dataOut[dataSize];

  for (int i = 0; i < cnt; i++) {
    for (unsigned int j = 0; j < dataSize; j++) {
      dataOut[j] = arrInt[i] >> (((dataSize - 1) * 8) - (j * 8)) & 0xff;
    }
    fwrite(dataOut, 1, dataSize, this->gdsFile);
  }

  return 0;
}